

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ExternalInstanceRef *name)

{
  const_iterator cVar1;
  GlobalName local_28;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->import_syms_)._M_t,(name->super_GlobalName).name);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->import_syms_)._M_t._M_impl.super__Rb_tree_header)
  {
    local_28.type = (name->super_GlobalName).type;
    local_28._4_4_ = *(undefined4 *)&(name->super_GlobalName).field_0x4;
    local_28.name = (name->super_GlobalName).name;
    WriteData(this,"instance->",10);
    Write(this,&local_28);
  }
  else {
    local_28.type = (name->super_GlobalName).type;
    local_28._4_4_ = *(undefined4 *)&(name->super_GlobalName).field_0x4;
    local_28.name = (name->super_GlobalName).name;
    WriteData(this,"(*instance->",0xc);
    Write(this,&local_28);
    WriteData(this,")",1);
  }
  return;
}

Assistant:

void CWriter::Write(const ExternalInstanceRef& name) {
  bool is_import = import_syms_.count(name.name) != 0;
  if (is_import) {
    Write("(*instance->", GlobalName(name), ")");
  } else {
    Write("instance->", GlobalName(name));
  }
}